

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

_Bool py_attack_real(player *p,loc_conflict grid,_Bool *fear)

{
  _Bool _Var1;
  int16_t iVar2;
  wchar_t ac_00;
  uint32_t uVar3;
  object *obj_00;
  char *pcVar4;
  source sVar5;
  source origin;
  wchar_t local_14c;
  char *name;
  player_blow *blow;
  wchar_t choice;
  object *obj_local;
  int local_108;
  wchar_t dmg;
  wchar_t weight;
  wchar_t s;
  wchar_t b;
  wchar_t j;
  char dmg_text [20];
  uint32_t local_dc;
  char local_d8 [4];
  uint32_t msg_type;
  char verb [20];
  wchar_t local_b4;
  wchar_t ac;
  wchar_t sleeping_bonus;
  wchar_t unarmed_blow_idx;
  wchar_t wStack_a4;
  _Bool confusing_blow;
  _Bool power_strike;
  _Bool armsman;
  _Bool success;
  _Bool do_quake;
  wchar_t splash;
  wchar_t drain;
  wchar_t chance;
  object *obj;
  char local_88 [7];
  _Bool stop;
  char m_name [80];
  monster *mon;
  size_t i;
  _Bool *fear_local;
  player *p_local;
  loc_conflict grid_local;
  
  m_name._72_8_ = square_monster((chunk *)cave,grid);
  obj._7_1_ = 0;
  _drain = equipped_item_by_slot_name(p,"weapon");
  splash = chance_of_melee_hit(p,_drain,(monster *)m_name._72_8_);
  _power_strike = 0;
  wStack_a4 = 0;
  unarmed_blow_idx._3_1_ = 0;
  unarmed_blow_idx._2_1_ = 0;
  unarmed_blow_idx._1_1_ = 0;
  unarmed_blow_idx._0_1_ = 0;
  sleeping_bonus._3_1_ = 0;
  ac = L'\0';
  local_b4 = L'\0';
  ac_00 = terrain_armor_adjust(grid,*(wchar_t *)(*(long *)m_name._72_8_ + 0x34),true);
  local_dc = 2;
  my_strcpy((char *)&b,"",0x14);
  my_strcpy(local_d8,"punch",0x14);
  monster_desc(local_88,0x50,(monster *)m_name._72_8_,L'\x15');
  _Var1 = monster_is_visible((monster *)m_name._72_8_);
  if (_Var1) {
    monster_race_track(p->upkeep,*(monster_race **)m_name._72_8_);
    health_track(p->upkeep,(monster *)m_name._72_8_);
  }
  _Var1 = player_of_has(p,L'\x1c');
  if (_Var1) {
    equip_learn_flag(p,L'\x1c');
    msgt(0x39,"You are too afraid to attack %s!",local_88);
    grid_local.x._3_1_ = false;
  }
  else {
    if ((*(short *)(m_name._72_8_ + 0x30) != 0) &&
       (_Var1 = monster_is_visible((monster *)m_name._72_8_), _Var1)) {
      local_b4 = (int)p->lev / 5 + L'\x05';
      _Var1 = flag_has_dbg((p->state).pflags,10,0x2a,"p->state.pflags","(PF_BACKSTAB)");
      if (_Var1) {
        local_b4 = local_b4 * 2;
      }
    }
    monster_wake((monster *)m_name._72_8_,false,L'd');
    mon_clear_timed((monster *)m_name._72_8_,L'\x06',L'\x01');
    *(undefined4 *)(m_name._72_8_ + 0x1a8) = 0xffffffff;
    unarmed_blow_idx._2_1_ = test_hit(splash + local_b4,ac_00);
    if ((bool)unarmed_blow_idx._2_1_) {
      if (_drain == (object *)0x0) {
        local_108 = 0;
      }
      else {
        iVar2 = object_weight_one(_drain);
        local_108 = (int)iVar2;
        my_strcpy(local_d8,"hit",0x14);
      }
      weight = L'\0';
      dmg = L'\0';
      for (s = L'\x02'; s < (int)(uint)(p->body).count; s = s + L'\x01') {
        obj_00 = slot_object(p,s);
        if (obj_00 != (object *)0x0) {
          improve_attack_modifier(p,obj_00,(monster *)m_name._72_8_,&weight,&dmg,local_d8,false);
        }
      }
      if (_drain != (object *)0x0) {
        improve_attack_modifier(p,_drain,(monster *)m_name._72_8_,&weight,&dmg,local_d8,false);
      }
      improve_attack_modifier(p,(object *)0x0,(monster *)m_name._72_8_,&weight,&dmg,local_d8,false);
      _Var1 = flag_has_dbg((p->state).pflags,10,0x2b,"p->state.pflags","(PF_UNARMED_COMBAT)");
      if ((_Var1) ||
         (_Var1 = flag_has_dbg((p->state).pflags,10,0x3e,"p->state.pflags","(PF_MARTIAL_ARTS)"),
         _Var1)) {
        obj_local._4_4_ =
             unarmed_damage(p,*(monster_race **)m_name._72_8_,splash + local_b4,&ac,
                            (_Bool *)&unarmed_blow_idx,(_Bool *)((long)&sleeping_bonus + 3));
      }
      else {
        obj_local._4_4_ =
             melee_damage(p,(monster *)m_name._72_8_,_drain,weight,dmg,local_b4,&local_dc,
                          (_Bool *)((long)&unarmed_blow_idx + 1));
      }
      wStack_a4 = (local_108 * obj_local._4_4_) / 100;
      _Var1 = player_of_has(p,L'\x11');
      if ((_Var1) && (L'2' < obj_local._4_4_)) {
        unarmed_blow_idx._3_1_ = 1;
        equip_learn_flag(p,L'\x11');
      }
      equip_learn_on_melee_attack(p);
      learn_brand_slay_from_melee(p,_drain,(monster *)m_name._72_8_);
      _Var1 = player_is_shapechanged(p);
      if (_Var1) {
        blow._4_4_ = Rand_div(p->shape->num_blows);
        name = (char *)p->shape->blows;
        while (blow._4_4_ != 0) {
          name = *(char **)name;
          blow._4_4_ = blow._4_4_ - 1;
        }
        my_strcpy(local_d8,*(char **)(name + 8),0x14);
      }
      if (obj_local._4_4_ < L'\x01') {
        obj_local._4_4_ = L'\0';
        local_dc = 3;
        my_strcpy(local_d8,"fail to harm",0x14);
      }
      if (((p->opts).opt[3] & 1U) != 0) {
        pcVar4 = format(" (%d)",(ulong)(uint)obj_local._4_4_);
        my_strcpy((char *)&b,pcVar4,0x14);
      }
      if ((_drain == (object *)0x0) &&
         ((_Var1 = flag_has_dbg((p->state).pflags,10,0x2b,"p->state.pflags","(PF_UNARMED_COMBAT)"),
          _Var1 || (_Var1 = flag_has_dbg((p->state).pflags,10,0x3e,"p->state.pflags",
                                         "(PF_MARTIAL_ARTS)"), _Var1)))) {
        pcVar4 = unarmed_blows[ac + L'\xffffffff'].name;
        if ((sleeping_bonus._3_1_ & 1) == 0) {
          if (((byte)unarmed_blow_idx & 1) == 0) {
            msgt(2,"You %s %s%s.",pcVar4,local_88,&b);
          }
          else {
            msgt(2,"Power Strike! You %s %s%s.",pcVar4,local_88,&b);
          }
        }
        else if (((byte)unarmed_blow_idx & 1) == 0) {
          msgt(2,"You %s and attempt to confuse %s%s.",pcVar4,local_88,&b);
        }
        else {
          msgt(2,"Power Strike! You attempt to confuse %s%s.",local_88,&b);
        }
      }
      else {
        for (mon = (monster *)0x0; mon < (monster *)0x7; mon = (monster *)((long)&mon->race + 1)) {
          if (local_dc == melee_hit_types[(long)mon].msg_type) {
            if ((local_b4 == L'\0') ||
               (_Var1 = monster_is_visible((monster *)m_name._72_8_), !_Var1)) {
              if ((unarmed_blow_idx._1_1_ & 1) != 0) {
                msgt(2,"Armsman hit!");
              }
            }
            else {
              _Var1 = flag_has_dbg((p->state).pflags,10,0x2a,"p->state.pflags","(PF_BACKSTAB)");
              if ((_Var1) && ((local_dc == 0x93 || (local_dc == 0x94)))) {
                msgt(2,"You ruthlessly sneak attack!");
              }
              else {
                msgt(2,"You rudely awaken the monster.");
              }
            }
            if (melee_hit_types[(long)mon].text == (char *)0x0) {
              msgt(local_dc,"You %s %s%s.",local_d8,local_88,&b);
            }
            else {
              msgt(local_dc,"You %s %s%s. %s",local_d8,local_88,&b);
            }
          }
        }
      }
      _Var1 = flag_has_dbg((p->state).pflags,10,0x4a,"p->state.pflags","(PF_FURY)");
      if (_Var1) {
        fury_boost(p);
      }
      blow_side_effects(p,(monster *)m_name._72_8_);
      if (obj_local._4_4_ < *(short *)(m_name._72_8_ + 0x2c)) {
        local_14c = obj_local._4_4_;
      }
      else {
        local_14c = (wchar_t)*(short *)(m_name._72_8_ + 0x2c);
      }
      _power_strike = local_14c;
      obj._7_1_ = mon_take_hit((monster *)m_name._72_8_,p,obj_local._4_4_,fear,(char *)0x0);
      if ((p->timed[0x31] != 0) && (uVar3 = Rand_div(0x32), uVar3 == 0)) {
        msg("You feel something give way!");
        player_over_exert(p,L'\x01',L'\x14',L'\0');
      }
      if ((((obj._7_1_ & 1) == 0) && (p->timed[0x2a] != 0)) &&
         (_Var1 = monster_is_living((monster *)m_name._72_8_), _Var1)) {
        sVar5 = source_player();
        origin.which = sVar5.which;
        pcVar4 = format("%d",(ulong)(uint)_power_strike);
        origin._4_4_ = 0;
        origin.what = sVar5.what;
        effect_simple(L'\x03',origin,pcVar4,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
      }
      if ((obj._7_1_ & 1) != 0) {
        *fear = false;
      }
      _Var1 = blow_after_effects(grid,obj_local._4_4_,wStack_a4,fear,
                                 (_Bool)(unarmed_blow_idx._3_1_ & 1));
      if (_Var1) {
        obj._7_1_ = 1;
      }
      grid_local.x._3_1_ = (_Bool)(obj._7_1_ & 1);
    }
    else {
      msgt(3,"You miss %s.",local_88);
      if ((p->timed[0x31] != 0) && (uVar3 = Rand_div(0x32), uVar3 == 0)) {
        msg("You feel strange...");
        player_over_exert(p,L'\x04',L'\x14',L'\x14');
      }
      grid_local.x._3_1_ = false;
    }
  }
  return grid_local.x._3_1_;
}

Assistant:

bool py_attack_real(struct player *p, struct loc grid, bool *fear)
{
	size_t i;

	/* Information about the target of the attack */
	struct monster *mon = square_monster(cave, grid);
	char m_name[80];
	bool stop = false;

	/* The weapon used */
	struct object *obj = equipped_item_by_slot_name(p, "weapon");

	/* Information about the attack */
	int chance = chance_of_melee_hit(p, obj, mon);
	int drain = 0;
	int splash = 0;
	bool do_quake = false;
	bool success = false;
	bool armsman = false;
	bool power_strike = false;
	bool confusing_blow = false;
	int unarmed_blow_idx = 0;

	/* Bonus to attack if monster is sleeping. */
	int sleeping_bonus = 0;

	int ac = terrain_armor_adjust(grid, mon->race->ac, true);

	char verb[20];
	uint32_t msg_type = MSG_HIT;
	char dmg_text[20];
	int j, b, s, weight, dmg;

	my_strcpy(dmg_text, "", sizeof(dmg_text));

	/* Default to punching */
	my_strcpy(verb, "punch", sizeof(verb));

	/* Extract monster name (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_TARG);

	/* Auto-Recall and track if possible and visible */
	if (monster_is_visible(mon)) {
		monster_race_track(p->upkeep, mon->race);
		health_track(p->upkeep, mon);
	}

	/* Handle player fear (only for invisible monsters) */
	if (player_of_has(p, OF_AFRAID)) {
		equip_learn_flag(p, OF_AFRAID);
		msgt(MSG_AFRAID, "You are too afraid to attack %s!", m_name);
		return false;
	}

	/* If the monster is sleeping and visible, it can be hit more easily. */
	if (mon->m_timed[MON_TMD_SLEEP] && monster_is_visible(mon)) {
		sleeping_bonus = 5 + p->lev / 5;
		if (player_has(p, PF_BACKSTAB)) {
			sleeping_bonus *= 2;
		}
	}

	/* Disturb the monster */
	monster_wake(mon, false, 100);
	mon_clear_timed(mon, MON_TMD_HOLD, MON_TMD_FLG_NOTIFY);

	/* Become hostile */
	mon->target.midx = -1;

	/* See if the player hit */
	success = test_hit(chance + sleeping_bonus, ac);

	/* If a miss, skip this hit */
	if (!success) {
		msgt(MSG_MISS, "You miss %s.", m_name);

		/* Small chance of bloodlust side-effects */
		if (p->timed[TMD_BLOODLUST] && one_in_(50)) {
			msg("You feel strange...");
			player_over_exert(p, PY_EXERT_SCRAMBLE, 20, 20);
		}

		return false;
	}

	if (obj) {
		/* Handle normal weapon */
		weight = object_weight_one(obj);
		my_strcpy(verb, "hit", sizeof(verb));
	} else {
		weight = 0;
	}

	/* Best attack from all slays or brands on all non-launcher equipment */
	b = 0;
	s = 0;
	for (j = 2; j < p->body.count; j++) {
		struct object *obj_local = slot_object(p, j);
		if (obj_local) {
			improve_attack_modifier(p, obj_local, mon, &b, &s, verb, false);
		}
	}

	/* Get the best attack from all slays or brands - weapon or temporary */
	if (obj) {
		improve_attack_modifier(p, obj, mon, &b, &s, verb, false);
	}
	improve_attack_modifier(p, NULL, mon, &b, &s, verb, false);

	if (player_has(p, PF_UNARMED_COMBAT) || player_has(p, PF_MARTIAL_ARTS)) {
		dmg = unarmed_damage(p, mon->race, chance + sleeping_bonus,
							 &unarmed_blow_idx, &power_strike, &confusing_blow);
	} else {
		/* Get the damage */
		dmg = melee_damage(p, mon, obj, b, s, sleeping_bonus, &msg_type,
						   &armsman);
	}

	/* Splash damage and earthquakes */
	splash = (weight * dmg) / 100;
	if (player_of_has(p, OF_IMPACT) && dmg > 50) {
		do_quake = true;
		equip_learn_flag(p, OF_IMPACT);
	}

	/* Learn by use */
	equip_learn_on_melee_attack(p);
	learn_brand_slay_from_melee(p, obj, mon);

	/* Substitute shape-specific blows for shapechanged players */
	if (player_is_shapechanged(p)) {
		int choice = randint0(p->shape->num_blows);
		struct player_blow *blow = p->shape->blows;
		while (choice--) {
			blow = blow->next;
		}
		my_strcpy(verb, blow->name, sizeof(verb));
	}

	/* No negative damage; change verb if no damage done */
	if (dmg <= 0) {
		dmg = 0;
		msg_type = MSG_MISS;
		my_strcpy(verb, "fail to harm", sizeof(verb));
	}

	/* Set damage value text if needed */
	if (OPT(p, show_damage)) {
		my_strcpy(dmg_text, format(" (%d)", dmg), sizeof(dmg_text));
	}

	/* Special messages for unarmed combat */
	if (!obj && (player_has(p, PF_UNARMED_COMBAT) ||
				 player_has(p, PF_MARTIAL_ARTS))) {
		const char *name = unarmed_blows[unarmed_blow_idx - 1].name;

		/* Display the attack message, feedback for relevant specialties */
		if (confusing_blow) {
			if (power_strike) {
				msgt(MSG_HIT, "Power Strike! You attempt to confuse %s%s.",
					 m_name, dmg_text);
			} else {
				msgt(MSG_HIT, "You %s and attempt to confuse %s%s.",
					 name, m_name, dmg_text);
			}
		} else {
			/* Basic attack message. */
			if (power_strike) {
				msgt(MSG_HIT, "Power Strike! You %s %s%s.", name, m_name,
					 dmg_text);
			} else {
				msgt(MSG_HIT, "You %s %s%s.", name, m_name, dmg_text);
			}
		}
	} else {
		for (i = 0; i < N_ELEMENTS(melee_hit_types); i++) {
			if (msg_type != melee_hit_types[i].msg_type) continue;

			/* Encourage the player to beat on sleeping monsters. */
			if (sleeping_bonus && monster_is_visible(mon)) {
				/* More "interesting" messages if we get a seriously good hit */
				if (player_has(p, PF_BACKSTAB) &&
					((msg_type == MSG_HIT_HI_GREAT)
					 || (msg_type == MSG_HIT_HI_SUPERB))) {
					msgt(MSG_HIT, "You ruthlessly sneak attack!");
				} else {
					/* Standard "wakeup call". */
					msgt(MSG_HIT, "You rudely awaken the monster.");
				}
			} else if (armsman) {
				/* Credit where credit is due, if no special message already */
				msgt(MSG_HIT, "Armsman hit!");
			}

			if (melee_hit_types[i].text)
				msgt(msg_type, "You %s %s%s. %s", verb, m_name, dmg_text,
					 melee_hit_types[i].text);
			else
				msgt(msg_type, "You %s %s%s.", verb, m_name, dmg_text);
		}
	}

	/* Specialty ability Fury */
	if (player_has(p, PF_FURY)) {
		fury_boost(p);
	}

	/* Pre-damage side effects */
	blow_side_effects(p, mon);

	/* Damage, check for hp drain, fear and death */
	drain = MIN(mon->hp, dmg);
	stop = mon_take_hit(mon, p, dmg, fear, NULL);

	/* Small chance of bloodlust side-effects */
	if (p->timed[TMD_BLOODLUST] && one_in_(50)) {
		msg("You feel something give way!");
		player_over_exert(p, PY_EXERT_CON, 20, 0);
	}

	if (!stop) {
		if (p->timed[TMD_ATT_VAMP] && monster_is_living(mon)) {
			effect_simple(EF_HEAL_HP, source_player(), format("%d", drain),
						  0, 0, 0, 0, 0, NULL);
		}
	}

	if (stop)
		(*fear) = false;

	/* Post-damage effects */
	if (blow_after_effects(grid, dmg, splash, fear, do_quake))
		stop = true;

	return stop;
}